

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O2

void __thiscall
slang::ast::DiagnosticVisitor::DiagnosticVisitor
          (DiagnosticVisitor *this,Compilation *compilation,size_t *numErrors,uint32_t errorLimit)

{
  this->compilation = compilation;
  this->numErrors = numErrors;
  this->errorLimit = errorLimit;
  this->visitInstances = true;
  this->disableCache = false;
  this->hierarchyProblem = false;
  boost::unordered::
  unordered_flat_map<slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry,_slang::hash<slang::ast::InstanceCacheKey,_void>,_std::equal_to<slang::ast::InstanceCacheKey>,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
  ::unordered_flat_map(&this->instanceCache);
  boost::unordered::
  unordered_flat_set<const_slang::ast::InstanceBodySymbol_*,_slang::hash<const_slang::ast::InstanceBodySymbol_*,_void>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
  ::unordered_flat_set(&this->activeInstanceBodies);
  boost::unordered::
  unordered_flat_set<const_slang::ast::DefinitionSymbol_*,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
  ::unordered_flat_set(&this->usedIfacePorts);
  (this->genericClasses).super_SmallVectorBase<const_slang::ast::GenericClassDefSymbol_*>.data_ =
       (pointer)(this->genericClasses).
                super_SmallVectorBase<const_slang::ast::GenericClassDefSymbol_*>.firstElement;
  (this->genericClasses).super_SmallVectorBase<const_slang::ast::GenericClassDefSymbol_*>.len = 0;
  (this->genericClasses).super_SmallVectorBase<const_slang::ast::GenericClassDefSymbol_*>.cap = 5;
  (this->dpiImports).super_SmallVectorBase<const_slang::ast::SubroutineSymbol_*>.data_ =
       (pointer)(this->dpiImports).super_SmallVectorBase<const_slang::ast::SubroutineSymbol_*>.
                firstElement;
  (this->dpiImports).super_SmallVectorBase<const_slang::ast::SubroutineSymbol_*>.len = 0;
  (this->dpiImports).super_SmallVectorBase<const_slang::ast::SubroutineSymbol_*>.cap = 5;
  (this->externIfaceProtos).super_SmallVectorBase<const_slang::ast::MethodPrototypeSymbol_*>.data_ =
       (pointer)(this->externIfaceProtos).
                super_SmallVectorBase<const_slang::ast::MethodPrototypeSymbol_*>.firstElement;
  (this->externIfaceProtos).super_SmallVectorBase<const_slang::ast::MethodPrototypeSymbol_*>.len = 0
  ;
  (this->externIfaceProtos).super_SmallVectorBase<const_slang::ast::MethodPrototypeSymbol_*>.cap = 5
  ;
  (this->modportsWithExports).
  super_SmallVectorBase<std::pair<const_slang::ast::InterfacePortSymbol_*,_const_slang::ast::ModportSymbol_*>_>
  .data_ = (pointer)(this->modportsWithExports).
                    super_SmallVectorBase<std::pair<const_slang::ast::InterfacePortSymbol_*,_const_slang::ast::ModportSymbol_*>_>
                    .firstElement;
  (this->modportsWithExports).
  super_SmallVectorBase<std::pair<const_slang::ast::InterfacePortSymbol_*,_const_slang::ast::ModportSymbol_*>_>
  .len = 0;
  (this->modportsWithExports).
  super_SmallVectorBase<std::pair<const_slang::ast::InterfacePortSymbol_*,_const_slang::ast::ModportSymbol_*>_>
  .cap = 2;
  boost::unordered::
  unordered_flat_map<const_slang::ast::Symbol_*,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>_>_>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>_>_>_>_>_>_>
  ::unordered_flat_map(&this->timingPathMap);
  return;
}

Assistant:

DiagnosticVisitor(Compilation& compilation, const size_t& numErrors, uint32_t errorLimit) :
        compilation(compilation), numErrors(numErrors), errorLimit(errorLimit) {}